

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O2

void helper_mtc0_memorymapid_mips(CPUMIPSState *env,target_ulong_conflict arg1)

{
  target_ulong_conflict tVar1;
  
  tVar1 = env->CP0_MemoryMapID;
  env->CP0_MemoryMapID = arg1;
  if (tVar1 == arg1) {
    return;
  }
  cpu_mips_tlb_flush_mips(env);
  return;
}

Assistant:

void helper_mtc0_memorymapid(CPUMIPSState *env, target_ulong arg1)
{
    int32_t old;
    old = env->CP0_MemoryMapID;
    env->CP0_MemoryMapID = (int32_t) arg1;
    /* If the MemoryMapID changes, flush qemu's TLB.  */
    if (old != env->CP0_MemoryMapID) {
        cpu_mips_tlb_flush(env);
    }
}